

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::CompressedCubeFormatCase::init
          (CompressedCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  Archive *archive;
  size_type sVar1;
  TextureCube *pTVar2;
  CompressedCubeFormatCase *this_local;
  
  context = this->m_renderCtx;
  contextInfo = this->m_renderCtxInfo;
  archive = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_filenames);
  pTVar2 = glu::TextureCube::create
                     (context,contextInfo,archive,
                      (int)((long)((ulong)(uint)((int)sVar1 >> 0x1f) << 0x20 | sVar1 & 0xffffffff) /
                           6),&this->m_filenames);
  this->m_texture = pTVar2;
  this->m_curFace = 0;
  this->m_isOk = true;
  return (int)this;
}

Assistant:

void CompressedCubeFormatCase::init (void)
{
	// Create texture.
	DE_ASSERT(m_filenames.size() % 6 == 0);
	m_texture = TextureCube::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size()/6, m_filenames);

	m_curFace	= 0;
	m_isOk		= true;
}